

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFFormFieldObjectHelper::getFontFromResource
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *resources,string *name)

{
  bool bVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  QPDFObjectHandle QVar3;
  bool local_111;
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  string local_a8 [32];
  QPDFObjectHandle local_88;
  byte local_74;
  byte local_73;
  byte local_72;
  allocator<char> local_71;
  string local_70 [32];
  QPDFObjectHandle local_50 [2];
  undefined1 local_29;
  string *local_28;
  string *name_local;
  QPDFObjectHandle *resources_local;
  QPDFFormFieldObjectHelper *this_local;
  QPDFObjectHandle *result;
  
  local_28 = (string *)CONCAT71(in_register_00000009,in_CL);
  local_29 = 0;
  name_local = name;
  resources_local = resources;
  this_local = this;
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this);
  local_72 = 0;
  local_73 = 0;
  local_74 = 0;
  local_aa = 0;
  local_ab = 0;
  local_ac = 0;
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)name);
  local_111 = false;
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_70,"/Font",&local_71);
    local_73 = 1;
    QPDFObjectHandle::getKey(local_50,name);
    local_74 = 1;
    bVar1 = QPDFObjectHandle::isDictionary(local_50);
    local_111 = false;
    _Var2._M_pi = extraout_RDX_00;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_aa = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_a8,"/Font",&local_a9);
      local_ab = 1;
      QPDFObjectHandle::getKey(&local_88,name);
      local_ac = 1;
      local_111 = QPDFObjectHandle::hasKey(&local_88,local_28);
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  if ((local_ac & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(&local_88);
    _Var2._M_pi = extraout_RDX_02;
  }
  if ((local_ab & 1) != 0) {
    std::__cxx11::string::~string(local_a8);
    _Var2._M_pi = extraout_RDX_03;
  }
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_a9);
    _Var2._M_pi = extraout_RDX_04;
  }
  if ((local_74 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(local_50);
    _Var2._M_pi = extraout_RDX_05;
  }
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string(local_70);
    _Var2._M_pi = extraout_RDX_06;
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_71);
    _Var2._M_pi = extraout_RDX_07;
  }
  if (local_111 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f0,"/Font",&local_f1);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_d0,name);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_d0.field_2,&local_d0);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,(QPDFObjectHandle *)&local_d0.field_2);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_d0.field_2);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_d0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    _Var2._M_pi = extraout_RDX_08;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFormFieldObjectHelper::getFontFromResource(QPDFObjectHandle resources, std::string const& name)
{
    QPDFObjectHandle result;
    if (resources.isDictionary() && resources.getKey("/Font").isDictionary() &&
        resources.getKey("/Font").hasKey(name)) {
        result = resources.getKey("/Font").getKey(name);
    }
    return result;
}